

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::InvalidSizeTest::createInstance
          (InvalidSizeTest *this,Context *context)

{
  ulong __n;
  VkResult result;
  int iVar1;
  GraphicsCacheTestInstance *this_00;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  _func_int **pp_Var4;
  Context *__s;
  TestError *this_01;
  ulong local_38;
  
  this_00 = (GraphicsCacheTestInstance *)operator_new(0x580);
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  (this_00->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__InvalidSizeTestInstance_00cf1b38;
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)0x0;
  pDVar2 = Context::getDeviceInterface
                     ((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  pVVar3 = Context::getDevice((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  local_38 = 0;
  result = (*pDVar2->_vptr_DeviceInterface[0x2e])
                     (pDVar2,pVVar3,
                      (this_00->super_CacheTestInstance).m_cache.
                      super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                      &local_38,0);
  ::vk::checkResult(result,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x6f8);
  __n = local_38;
  local_38 = local_38 - 1;
  pp_Var4 = (_func_int **)operator_new__(__n);
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = pp_Var4;
  memset(pp_Var4,0,__n);
  iVar1 = (*pDVar2->_vptr_DeviceInterface[0x2e])
                    (pDVar2,pVVar3,
                     (this_00->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &local_38,pp_Var4);
  if (iVar1 == 5) {
    pp_Var4 = this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance;
    if (pp_Var4 != (_func_int **)0x0) {
      operator_delete__(pp_Var4);
    }
    this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    local_38 = 0x1f;
    pp_Var4 = (_func_int **)operator_new__(__n);
    this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = pp_Var4;
    memset(pp_Var4,0,__n);
    iVar1 = (*pDVar2->_vptr_DeviceInterface[0x2e])
                      (pDVar2,pVVar3,
                       (this_00->super_CacheTestInstance).m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                       &local_38,pp_Var4);
    if (iVar1 == 5) {
      __s = (Context *)operator_new__(__n);
      this_00[1].super_CacheTestInstance.super_TestInstance.m_context = __s;
      memset(__s,0,__n);
      iVar1 = bcmp(this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance,__s,__n)
      ;
      if ((iVar1 == 0) && (local_38 == 0)) {
        return (TestInstance *)this_00;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,
                 "Data needs to be empty and data size should be 0 when invalid size is passed to GetPipelineCacheData!"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                 ,0x715);
    }
    else {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"GetPipelineCacheData should return VK_INCOMPLETE state!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                 ,0x710);
    }
  }
  else {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"GetPipelineCacheData should return VK_INCOMPLETE state!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x703);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* InvalidSizeTest::createInstance (Context& context) const
{
	return new InvalidSizeTestInstance(context, &m_param);
}